

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O2

DescriptorFlags __thiscall
Js::SimpleTypeHandler<2UL>::GetSetter
          (SimpleTypeHandler<2UL> *this,DynamicObject *instance,JavascriptString *propertyNameString
          ,Var *setterValue,PropertyValueInfo *info,ScriptContext *requestContext)

{
  code *pcVar1;
  Type *pTVar2;
  bool bVar3;
  charcount_t cVar4;
  DescriptorFlags DVar5;
  char16 *pcVar6;
  undefined4 *puVar7;
  Type *pTVar8;
  long lVar9;
  undefined1 local_40 [8];
  CharacterBuffer<char16_t> propertyName;
  
  pcVar6 = JavascriptString::GetString(propertyNameString);
  cVar4 = JavascriptString::GetLength(propertyNameString);
  bVar3 = PropertyRecord::IsPropertyNameNumeric(pcVar6,cVar4);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x27c,
                                "(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()))"
                                ,
                                "Numeric property names should have been converted to uint or PropertyRecord* before calling GetSetter"
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar7 = 0;
  }
  pcVar6 = JavascriptString::GetString(propertyNameString);
  cVar4 = JavascriptString::GetLength(propertyNameString);
  Memory::WriteBarrierPtr<const_char16_t>::WriteBarrierSet
            ((WriteBarrierPtr<const_char16_t> *)local_40,pcVar6);
  lVar9 = -1;
  DVar5 = None;
  pTVar2 = this->descriptors;
  propertyName.string.ptr._0_4_ = cVar4;
  do {
    pTVar8 = pTVar2;
    lVar9 = lVar9 + 1;
    if (this->propertyCount <= lVar9) {
      return None;
    }
    bVar3 = PropertyRecord::Equals((pTVar8->Id).ptr,(CharacterBuffer<char16_t> *)local_40);
    pTVar2 = pTVar8 + 1;
  } while (!bVar3);
  if (((pTVar8->field_1).Attributes & 8) == 0) {
    DVar5 = (pTVar8->field_1).Attributes & Writable | Data;
  }
  return DVar5;
}

Assistant:

DescriptorFlags SimpleTypeHandler<size>::GetSetter(DynamicObject* instance, JavascriptString* propertyNameString, Var* setterValue, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        AssertMsg(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()),
            "Numeric property names should have been converted to uint or PropertyRecord* before calling GetSetter");

        JsUtil::CharacterBuffer<WCHAR> propertyName(propertyNameString->GetString(), propertyNameString->GetLength());
        for (int i = 0; i < propertyCount; i++)
        {
            if (descriptors[i].Id->Equals(propertyName))
            {
                if (descriptors[i].Attributes & PropertyDeleted)
                {
                    return None;
                }
                return (descriptors[i].Attributes & PropertyWritable) ? WritableData : Data;
            }
        }

        return None;
    }